

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.cpp
# Opt level: O0

bool Kumu::read_BER(byte_t *buf,ui64_t *val)

{
  byte bVar1;
  byte bVar2;
  byte local_22;
  ui8_t i;
  ui8_t ber_size;
  ui64_t *val_local;
  byte_t *buf_local;
  
  if ((buf == (byte_t *)0x0) || (val == (ui64_t *)0x0)) {
    buf_local._7_1_ = false;
  }
  else if ((*buf & 0x80) == 0) {
    buf_local._7_1_ = false;
  }
  else {
    *val = 0;
    bVar1 = *buf;
    bVar2 = (bVar1 & 0xf) + 1;
    if (bVar2 < 10) {
      for (local_22 = 1; local_22 < bVar2; local_22 = local_22 + 1) {
        if (buf[local_22] != '\0') {
          *val = (ulong)buf[local_22] << (((bVar1 & 0xf) - local_22) * '\b' & 0x3f) | *val;
        }
      }
      buf_local._7_1_ = true;
    }
    else {
      buf_local._7_1_ = false;
    }
  }
  return buf_local._7_1_;
}

Assistant:

bool
Kumu::read_BER(const byte_t* buf, ui64_t* val)
{
  ui8_t ber_size, i;
  
  if ( buf == 0 || val == 0 )
    return false;

  if ( ( *buf & 0x80 ) == 0 )
    return false;

  *val = 0;
  ber_size = ( *buf & 0x0f ) + 1;

  if ( ber_size > 9 )
    return false;

  for ( i = 1; i < ber_size; i++ )
    {
      if ( buf[i] > 0 )
	*val |= (ui64_t)buf[i] << ( ( ( ber_size - 1 ) - i ) * 8 );
    }

  return true;
}